

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recv.c
# Opt level: O0

yrmcds_error text_recv(yrmcds *c,yrmcds_response *r)

{
  int iVar1;
  yrmcds_error yVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t uVar6;
  bool bVar7;
  char *data;
  yrmcds_error e_1;
  size_t required;
  uint64_t cas;
  size_t data_len;
  uint64_t bytes;
  uint64_t flags;
  char *key_end;
  char *p_1;
  uint64_t value;
  char *p;
  size_t resp_len;
  void *pvStack_28;
  yrmcds_error e;
  char *pos;
  yrmcds_response *r_local;
  yrmcds *c_local;
  
  while( true ) {
    bVar7 = true;
    if (c->used != 0) {
      pvStack_28 = memchr(c->recvbuf,10,c->used);
      bVar7 = pvStack_28 == (void *)0x0;
    }
    if (!bVar7) break;
    yVar2 = recv_data(c);
    if (yVar2 != YRMCDS_OK) {
      return yVar2;
    }
  }
  if (((long)pvStack_28 - (long)c->recvbuf < 2) || (*(char *)((long)pvStack_28 + -1) != '\r')) {
    c->invalid = 1;
    return YRMCDS_PROTOCOL_ERROR;
  }
  pcVar3 = (char *)((long)pvStack_28 + -1);
  uVar4 = (long)pcVar3 - (long)c->recvbuf;
  memset(r,0,0x50);
  uVar6 = c->rserial + 1;
  c->rserial = uVar6;
  r->serial = uVar6;
  r->length = uVar4 + 2;
  r->status = YRMCDS_STATUS_OK;
  r->command = YRMCDS_CMD_BOTTOM;
  if ((uVar4 != 2) || (*(short *)c->recvbuf != 0x4b4f)) {
    if ((uVar4 == 3) && (iVar1 = memcmp(c->recvbuf,"END",3), iVar1 == 0)) {
      r->status = YRMCDS_STATUS_NOTFOUND;
    }
    else if ((uVar4 == 5) && (iVar1 = memcmp(c->recvbuf,"ERROR",5), iVar1 == 0)) {
      r->status = YRMCDS_STATUS_UNKNOWNCOMMAND;
    }
    else {
      if (uVar4 == 6) {
        iVar1 = memcmp(c->recvbuf,"STORED",6);
        if (iVar1 == 0) goto LAB_001430cf;
        iVar1 = memcmp(c->recvbuf,"EXISTS",6);
        if (iVar1 == 0) {
          r->status = YRMCDS_STATUS_EXISTS;
          goto LAB_001430cf;
        }
      }
      if ((uVar4 != 7) ||
         ((iVar1 = memcmp(c->recvbuf,"DELETED",7), iVar1 != 0 &&
          (iVar1 = memcmp(c->recvbuf,"TOUCHED",7), iVar1 != 0)))) {
        if ((uVar4 == 9) && (iVar1 = memcmp(c->recvbuf,"NOT_FOUND",9), iVar1 == 0)) {
          r->status = YRMCDS_STATUS_NOTFOUND;
        }
        else if ((uVar4 == 10) && (iVar1 = memcmp(c->recvbuf,"NOT_STORED",10), iVar1 == 0)) {
          r->status = YRMCDS_STATUS_NOTSTORED;
        }
        else if ((uVar4 == 0) || ((*c->recvbuf < '0' || ('9' < *c->recvbuf)))) {
          if ((uVar4 < 9) || (*(long *)c->recvbuf != 0x204e4f4953524556)) {
            if ((6 < uVar4) && (iVar1 = memcmp(c->recvbuf,"VALUE ",6), iVar1 == 0)) {
              for (key_end = c->recvbuf + 6; *key_end == ' '; key_end = key_end + 1) {
              }
              if ((key_end != pcVar3) &&
                 (pcVar3 = (char *)memchr(key_end,0x20,(long)pcVar3 - (long)key_end),
                 pcVar3 != (char *)0x0)) {
                r->key = key_end;
                r->key_len = (long)pcVar3 - (long)key_end;
                bytes = 0;
                for (key_end = pcVar3; *key_end == ' '; key_end = key_end + 1) {
                }
                while( true ) {
                  bVar7 = false;
                  if ('/' < *key_end) {
                    bVar7 = *key_end < ':';
                  }
                  if (!bVar7) break;
                  bytes = (long)(*key_end + -0x30) + bytes * 10;
                  key_end = key_end + 1;
                }
                if (*key_end == ' ') {
                  r->flags = (uint32_t)bytes;
                  data_len = 0;
                  for (; *key_end == ' '; key_end = key_end + 1) {
                  }
                  while( true ) {
                    bVar7 = false;
                    if ('/' < *key_end) {
                      bVar7 = *key_end < ':';
                    }
                    if (!bVar7) break;
                    data_len = (long)(*key_end + -0x30) + data_len * 10;
                    key_end = key_end + 1;
                  }
                  if (0x3200000 < data_len) {
                    c->invalid = 1;
                    return YRMCDS_PROTOCOL_ERROR;
                  }
                  for (; *key_end == ' '; key_end = key_end + 1) {
                  }
                  if (('/' < *key_end) && (*key_end < ':')) {
                    required = 0;
                    for (; *key_end == ' '; key_end = key_end + 1) {
                    }
                    while( true ) {
                      bVar7 = false;
                      if ('/' < *key_end) {
                        bVar7 = *key_end < ':';
                      }
                      if (!bVar7) break;
                      required = (long)(*key_end + -0x30) + required * 10;
                      key_end = key_end + 1;
                    }
                    uVar5 = uVar4 + data_len + 9;
                    while (c->used < uVar5) {
                      yVar2 = recv_data(c);
                      if (yVar2 != YRMCDS_OK) {
                        return yVar2;
                      }
                    }
                    pcVar3 = c->recvbuf;
                    iVar1 = memcmp(pcVar3 + uVar4 + 2 + data_len,"\r\nEND\r\n",7);
                    if (iVar1 != 0) {
                      c->invalid = 1;
                      return YRMCDS_PROTOCOL_ERROR;
                    }
                    r->length = uVar5;
                    r->flags = (uint32_t)bytes;
                    r->data = pcVar3 + uVar4 + 2;
                    r->data_len = data_len;
                    r->cas_unique = required;
                    goto LAB_001430cf;
                  }
                }
              }
            }
            r->status = YRMCDS_STATUS_OTHER;
            fprintf(_stderr,"[libyrmcds] unknown response: %.*s\n",uVar4 & 0xffffffff,c->recvbuf);
          }
          else {
            r->data_len = uVar4 - 8;
            r->data = c->recvbuf + 8;
          }
        }
        else {
          value = (uint64_t)c->recvbuf;
          p_1 = (char *)0x0;
          for (; *(char *)value == ' '; value = value + 1) {
          }
          while( true ) {
            bVar7 = false;
            if ('/' < *(char *)value) {
              bVar7 = *(char *)value < ':';
            }
            if (!bVar7) break;
            p_1 = (char *)((long)(*(char *)value + -0x30) + (long)p_1 * 10);
            value = value + 1;
          }
          r->value = (uint64_t)p_1;
        }
      }
    }
  }
LAB_001430cf:
  c->last_size = r->length;
  return YRMCDS_OK;
}

Assistant:

static yrmcds_error text_recv(yrmcds* c, yrmcds_response* r) {
    char* pos;
    while( c->used == 0 ||
           (pos = (char*)memchr(c->recvbuf, '\n', c->used)) == NULL ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }
    // make sure the buffer contains CRLF.
    if( (pos - c->recvbuf) < 2 || *(pos-1) != '\r' ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    pos--;
    size_t resp_len = (size_t)(pos - c->recvbuf);

    memset(r, 0, sizeof(yrmcds_response));
    r->serial = ++c->rserial;
    r->length = resp_len + 2;
    r->status = YRMCDS_STATUS_OK;
    r->command = YRMCDS_CMD_BOTTOM;  // dummy for emulating binary protocol

    if( resp_len == 2 && memcmp(c->recvbuf, "OK", 2) == 0 ) {
        // successful response for flush_all
        goto FINISH;
    }
    if( resp_len == 3 && memcmp(c->recvbuf, "END", 3) == 0 ) {
        // get failed for non-existing object.
        r->status = YRMCDS_STATUS_NOTFOUND;
        goto FINISH;
    }
    if( resp_len == 5 && memcmp(c->recvbuf, "ERROR", 5) == 0 ) {
        r->status = YRMCDS_STATUS_UNKNOWNCOMMAND;
        goto FINISH;
    }
    if( resp_len == 6 ) {
        if( memcmp(c->recvbuf, "STORED", 6) == 0 ) {
            // successful response for storage commands.
            goto FINISH;
        }
        if( memcmp(c->recvbuf, "EXISTS", 6) == 0 ) {
            // failure response for cas.
            r->status = YRMCDS_STATUS_EXISTS;
            goto FINISH;
        }
    }
    if( resp_len == 7 ) {
        if( memcmp(c->recvbuf, "DELETED", 7) == 0 )
            // successful response for delete.
            goto FINISH;
        if( memcmp(c->recvbuf, "TOUCHED", 7) == 0 )
            // successful response for touch.
            goto FINISH;
    }
    if( resp_len == 9 && memcmp(c->recvbuf, "NOT_FOUND", 9) == 0 ) {
        // failure response for cas, delete, incr, decr, or touch.
        r->status = YRMCDS_STATUS_NOTFOUND;
        goto FINISH;
    }
    if( resp_len == 10 && memcmp(c->recvbuf, "NOT_STORED", 10) == 0 ) {
        // failure response for add, replace, append, or prepend.
        r->status = YRMCDS_STATUS_NOTSTORED;
        goto FINISH;
    }
    if( resp_len > 0 && '0' <= c->recvbuf[0] && c->recvbuf[0] <= '9' ) {
        // successful response for incr or decr.
        const char* p = c->recvbuf;
        PARSE_UINT(value);
        r->value = value;
        goto FINISH;
    }
    if( resp_len > 8 && memcmp(c->recvbuf, "VERSION ", 8) == 0 ) {
        // successful response for version.
        r->data_len = resp_len - 8;
        r->data = c->recvbuf + 8;
        goto FINISH;
    }
    if( resp_len > 6 && memcmp(c->recvbuf, "VALUE ", 6) == 0 ) {
        // successful response for gets.
        const char* p = c->recvbuf + 6;
        while( *p == ' ' ) p++;
        if( p == pos ) goto UNKNOWN;

        const char* key_end = memchr(p, ' ', (size_t)(pos - p));
        if( key_end == NULL ) goto UNKNOWN;
        r->key = p;
        r->key_len = (size_t)(key_end - p);

        p = key_end;
        PARSE_UINT(flags);
        if( *p != ' ' ) goto UNKNOWN;
        r->flags = (uint32_t)flags;

        PARSE_UINT(bytes);
        if( bytes > MAX_CAPACITY ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        size_t data_len = (size_t)bytes;

        while( *p == ' ' ) p++;
        if( *p < '0' || '9' < *p ) goto UNKNOWN;
        PARSE_UINT(cas);

        size_t required = resp_len + 2 + data_len + 7; // CRLF "END" CRLF
        while( c->used < required ) {
            yrmcds_error e = recv_data(c);
            if( e != 0 ) return e;
        }

        const char* data = c->recvbuf + (resp_len + 2);
        if( memcmp(data + data_len, "\r\nEND\r\n", 7) != 0 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->length = required;
        r->flags = (uint32_t)flags;

#ifdef LIBYRMCDS_USE_LZ4
        if( c->compress_size && (r->flags & YRMCDS_FLAG_COMPRESS) ) {
            if( data_len == 0 ) {
                c->invalid = 1;
                return YRMCDS_PROTOCOL_ERROR;
            }
            r->flags &= ~(uint32_t)YRMCDS_FLAG_COMPRESS;
            uint32_t decompress_size = ntoh32(data);
            if( UINT32_MAX > INT_MAX ) {
                if( decompress_size > INT_MAX ) {
                    c->invalid = 1;
                    return YRMCDS_PROTOCOL_ERROR;
                }
            }
            c->decompressed = (char*)malloc(decompress_size);
            if( c->decompressed == NULL )
                return YRMCDS_OUT_OF_MEMORY;
            int d = LZ4_decompress_safe(data + sizeof(uint32_t),
                                        c->decompressed,
                                        (int)(data_len - sizeof(uint32_t)),
                                        (int)decompress_size);
            if( d != decompress_size ) {
                c->invalid = 1;
                return YRMCDS_PROTOCOL_ERROR;
            }
            data = c->decompressed;
            data_len = (size_t)decompress_size;
        }
#endif // LIBYRMCDS_USE_LZ4
        r->data = data;
        r->data_len = data_len;
        r->cas_unique = cas;
        goto FINISH;
    }

  UNKNOWN:
    r->status = YRMCDS_STATUS_OTHER;
    fprintf(stderr, "[libyrmcds] unknown response: %.*s\n",
            (int)resp_len, c->recvbuf);

  FINISH:
    c->last_size = r->length;
    return YRMCDS_OK;
}